

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

Literal getInt(int line)

{
  char *__ptr;
  ulong uVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  Literal LVar5;
  long l;
  anon_union_8_4_50a03f35_for_Literal_2 local_20;
  
  do {
    __ptr = readString();
    bVar3 = (*__ptr - 0x2bU & 0xfd) == 0;
    uVar1 = (ulong)bVar3;
    cVar2 = __ptr[uVar1];
    bVar4 = bVar3;
    if (cVar2 != '\0') {
      do {
        if ((byte)(cVar2 - 0x3aU) < 0xf6) goto LAB_00106e20;
        cVar2 = __ptr[uVar1 + 1];
        uVar1 = uVar1 + 1;
      } while (cVar2 != '\0');
      bVar4 = uVar1 == 1;
    }
    if (!(bool)(bVar3 & bVar4)) {
      local_20.iVal = 0;
      __isoc99_sscanf(__ptr,"%ld",&local_20);
      free(__ptr);
      LVar5._0_8_ = (ulong)(uint)line | 0x100000000;
      LVar5.field_2.iVal = local_20.iVal;
      return LVar5;
    }
LAB_00106e20:
    printf("\x1b[33m\n[Warning] [Input Error] Not an integer : %s!\n[Re-Input] \x1b[0m",__ptr);
  } while( true );
}

Assistant:

Literal getInt(int line){
    char *s = readString();
    while(!isInt(s)){
        printf(warning("[Input Error] Not an integer : %s!\n[Re-Input] "), s);
        s = readString();
    }
    long l = 0;
    sscanf(s, "%ld", &l);
    memfree(s);
    Literal lit = {line, LIT_INT, {0}};
    lit.iVal = l;
    return lit;
}